

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::GeneratedCodeInfo::GeneratedCodeInfo(GeneratedCodeInfo *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__GeneratedCodeInfo_0042ba60;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->annotation_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->annotation_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->annotation_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->annotation_).super_RepeatedPtrFieldBase.total_size_ = 0;
  if (this != (GeneratedCodeInfo *)&_GeneratedCodeInfo_default_instance_) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

GeneratedCodeInfo::GeneratedCodeInfo()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.GeneratedCodeInfo)
}